

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btOptimizedBvhNode>::copy
          (btAlignedObjectArray<btOptimizedBvhNode> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  btOptimizedBvhNode *pbVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long in_RCX;
  int i;
  long lVar11;
  
  lVar10 = (long)(int)dst;
  lVar11 = lVar10 << 6;
  for (; lVar10 < (int)src; lVar10 = lVar10 + 1) {
    pbVar2 = this->m_data;
    puVar1 = (undefined8 *)((long)(pbVar2->m_aabbMinOrg).m_floats + lVar11);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pbVar2->m_aabbMaxOrg).m_floats + lVar11);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    uVar7 = *(undefined8 *)(pbVar2->m_padding + lVar11 + -0xc);
    uVar8 = *(undefined8 *)(pbVar2->m_padding + lVar11 + -0xc + 8);
    uVar9 = *(undefined8 *)(pbVar2->m_padding + lVar11 + 4 + 8);
    puVar1 = (undefined8 *)(in_RCX + 0x30 + lVar11);
    *puVar1 = *(undefined8 *)(pbVar2->m_padding + lVar11 + 4);
    puVar1[1] = uVar9;
    puVar1 = (undefined8 *)(in_RCX + 0x20 + lVar11);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)(in_RCX + 0x10 + lVar11);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    *(undefined8 *)(in_RCX + lVar11) = uVar3;
    ((undefined8 *)(in_RCX + lVar11))[1] = uVar4;
    lVar11 = lVar11 + 0x40;
  }
  return (int)lVar10;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}